

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start_vacuum.cpp
# Opt level: O2

void pstore::start_vacuum(database *db)

{
  UI_STRING *uis;
  UI *ui;
  writer wr;
  fifo_path fifo;
  czstring local_128 [4];
  code *local_108 [2];
  code *local_f8;
  code *local_f0;
  code *local_e8 [2];
  code *local_d8;
  code *local_d0;
  writer local_c8;
  fifo_path local_88;
  
  local_e8[1] = (code *)0x0;
  local_e8[0] = brokerface::fifo_path::default_update_cb;
  local_d0 = std::
             _Function_handler<void_(pstore::brokerface::fifo_path::operation),_void_(*)(pstore::brokerface::fifo_path::operation)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<void_(pstore::brokerface::fifo_path::operation),_void_(*)(pstore::brokerface::fifo_path::operation)>
             ::_M_manager;
  brokerface::fifo_path::fifo_path(&local_88,(czstring)0x0,(update_callback *)local_e8);
  std::_Function_base::~_Function_base((_Function_base *)local_e8);
  local_108[1] = (code *)0x0;
  local_108[0] = brokerface::writer::default_callback;
  local_f0 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_f8 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  brokerface::writer::writer(&local_c8,(UI *)&local_88,(UI_STRING *)local_108);
  std::_Function_base::~_Function_base((_Function_base *)local_108);
  (*((db->storage_).file_.super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_file_base[5])(local_128);
  ui = (UI *)0x0;
  brokerface::send_message(&local_c8,false,"GC",local_128[0]);
  std::__cxx11::string::~string((string *)local_128);
  brokerface::writer::~writer(&local_c8,ui,uis);
  brokerface::fifo_path::~fifo_path(&local_88);
  return;
}

Assistant:

void start_vacuum (database const & db) {
        brokerface::fifo_path const fifo (nullptr);
        brokerface::writer wr (fifo);
        brokerface::send_message (wr, false /*error on timeout*/, "GC", db.path ().c_str ());
    }